

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

QList<int> *
QFontDatabase::smoothSizes(QList<int> *__return_storage_ptr__,QString *family,QString *styleName)

{
  long lVar1;
  int *piVar2;
  ushort uVar3;
  QtFontFoundry *this;
  double dVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *pTVar9;
  QtFontFamily *pQVar10;
  QtFontStyle *pQVar11;
  iterator iVar12;
  iterator iVar13;
  ulong uVar14;
  undefined4 extraout_var_01;
  long lVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  QDeadlineTimer QVar18;
  QList<int> local_98;
  QString local_78;
  QString local_58;
  int local_40;
  Key local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x80))
                    ((long *)CONCAT44(extraout_var,iVar6));
  if (cVar5 == '\0') {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    local_78.d.size = 0;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)0x0;
    parseFontName(family,&local_78,&local_58);
    pTVar9 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
             ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                           *)family);
    if (pTVar9 != (Type *)0x0) {
      QVar18.t2 = 0xffffffff;
      QVar18.type = 0x7fffffff;
      QVar18.t1 = (qint64)pTVar9;
      QRecursiveMutex::tryLock(QVar18);
    }
    QFontDatabasePrivate::ensureFontDatabase();
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (int *)0x0;
    local_98.d.size = 0;
    pQVar10 = QFontDatabasePrivate::family
                        (&QFontDatabasePrivate::instance::instance,&local_58,EnsurePopulated);
    if (pQVar10 == (QtFontFamily *)0x0) {
      (__return_storage_ptr__->d).d = local_98.d.d;
      (__return_storage_ptr__->d).ptr = local_98.d.ptr;
      (__return_storage_ptr__->d).size = local_98.d.size;
    }
    else {
      iVar6 = qt_defaultDpiY();
      local_3c = (Key)0xaaaaaaaa;
      QtFontStyle::Key::Key(&local_3c,styleName);
      if (0 < pQVar10->count) {
        lVar15 = 0;
        do {
          this = pQVar10->foundries[lVar15];
          if (local_78.d.size == 0) {
LAB_004956af:
            pQVar11 = QtFontFoundry::style(this,&local_3c,styleName,false);
            if (pQVar11 != (QtFontStyle *)0x0) {
              uVar8 = *(uint *)&pQVar11->field_0x4;
              if ((uVar8 & 2) != 0) {
                iVar6 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration
                          [0xd])();
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x88))
                          (__return_storage_ptr__,(long *)CONCAT44(extraout_var_01,iVar6));
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
                  }
                }
                goto LAB_0049582c;
              }
              if (3 < (int)uVar8) {
                lVar17 = 0;
                do {
                  uVar3 = *(ushort *)&pQVar11->pixelSizes[lVar17].field_0x8;
                  if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                    dVar4 = ((double)uVar3 * 72.0) / (double)iVar6;
                    iVar7 = (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) +
                                 dVar4);
                    if (local_98.d.size != 0) {
                      lVar16 = 0;
                      do {
                        if (local_98.d.size * 4 - lVar16 == 0) goto LAB_0049576f;
                        lVar1 = lVar16 + 4;
                        piVar2 = (int *)((long)local_98.d.ptr + lVar16);
                        lVar16 = lVar1;
                      } while (*piVar2 != iVar7);
                      if (lVar1 != 0) goto LAB_0049578a;
                    }
LAB_0049576f:
                    local_40 = iVar7;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_98,local_98.d.size,&local_40);
                    QList<int>::end(&local_98);
                    uVar8 = *(uint *)&pQVar11->field_0x4;
                  }
LAB_0049578a:
                  lVar17 = lVar17 + 1;
                } while (lVar17 < (int)uVar8 >> 2);
              }
            }
          }
          else {
            iVar7 = QString::compare((QString *)this,(CaseSensitivity)&local_78);
            if (iVar7 == 0) goto LAB_004956af;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pQVar10->count);
      }
      iVar12 = QList<int>::begin(&local_98);
      iVar13 = QList<int>::end(&local_98);
      if (iVar12.i != iVar13.i) {
        uVar14 = (long)iVar13.i - (long)iVar12.i >> 2;
        lVar15 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar12.i,iVar13.i,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar12.i,iVar13.i);
      }
      (__return_storage_ptr__->d).d = local_98.d.d;
      (__return_storage_ptr__->d).ptr = local_98.d.ptr;
      (__return_storage_ptr__->d).size = local_98.d.size;
    }
LAB_0049582c:
    if (pTVar9 != (Type *)0x0) {
      QRecursiveMutex::unlock();
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004958ff;
  }
  else {
    iVar6 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004958ff:
      __stack_chk_fail();
    }
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x88))
              (__return_storage_ptr__,(long *)CONCAT44(extraout_var_00,iVar6));
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QFontDatabase::smoothSizes(const QString &family,
                                            const QString &styleName)
{
    if (QGuiApplicationPrivate::platformIntegration()->fontDatabase()->fontsAlwaysScalable())
        return standardSizes();

    bool smoothScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QList<int> sizes;

    QtFontFamily *fam = d->family(familyName);
    if (!fam)
        return sizes;

    const int dpi = qt_defaultDpiY(); // embedded

    QtFontStyle::Key styleKey(styleName);
    for (int j = 0; j < fam->count; j++) {
        QtFontFoundry *foundry = fam->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            QtFontStyle *style = foundry->style(styleKey, styleName);
            if (!style) continue;

            if (style->smoothScalable) {
                smoothScalable = true;
                goto end;
            }
            for (int l = 0; l < style->count; l++) {
                const QtFontSize *size = style->pixelSizes + l;

                if (size->pixelSize != 0 && size->pixelSize != SMOOTH_SCALABLE) {
                    const int pointSize = qRound(size->pixelSize * 72.0 / dpi);
                    if (! sizes.contains(pointSize))
                        sizes.append(pointSize);
                }
            }
        }
    }
 end:
    if (smoothScalable)
        return QFontDatabase::standardSizes();

    std::sort(sizes.begin(), sizes.end());
    return sizes;
}